

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxCoroutine.cpp
# Opt level: O3

void __thiscall
Jinx::Impl::Coroutine::Coroutine
          (Coroutine *this,shared_ptr<Jinx::Impl::Script> *script,RuntimeID functionID,
          Parameters *params)

{
  _Rb_tree_header *p_Var1;
  ScriptIPtr *pSVar2;
  element_type *peVar3;
  element_type *bytecode;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_void__Op_any_ptr__Arg_ptr *p_Var4;
  _func_void__Op_any_ptr__Arg_ptr *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pVVar6;
  bool bVar7;
  char *message;
  Variant *param;
  pointer value;
  FunctionDefinitionPtr functionDef;
  _Arg __arg;
  code *local_90;
  undefined8 local_88;
  Any local_80;
  undefined1 local_70 [16];
  undefined1 local_60 [40];
  _Arg local_38;
  
  (this->super_ICoroutine)._vptr_ICoroutine = (_func_int **)&PTR_IsFinished_00274ba0;
  (this->m_script).super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_script).super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_returnValue).m_type = Null;
  peVar3 = (script->super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  bytecode = (peVar3->m_runtime).super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (peVar3->m_runtime).super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  Runtime::FindFunction((Runtime *)local_70,(RuntimeID)bytecode);
  if ((_func_int **)local_70._0_8_ == (_func_int **)0x0) {
    message = "Could not find function definition for coroutine";
  }
  else {
    p_Var4 = *(_func_void__Op_any_ptr__Arg_ptr **)(local_70._0_8_ + 0x10);
    if (p_Var4 != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      local_80._M_storage = (_Storage)((_Storage *)(local_70._0_8_ + 0x18))->_M_ptr;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_storage._M_ptr !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_80._M_storage._M_ptr + 8) =
               *(_Atomic_word *)((long)local_80._M_storage._M_ptr + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_80._M_storage._M_ptr + 8) =
               *(_Atomic_word *)((long)local_80._M_storage._M_ptr + 8) + 1;
        }
      }
      peVar3 = (script->super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_88 = 0;
      p_Var5 = (peVar3->m_userContext)._M_manager;
      local_80._M_manager = p_Var4;
      if (p_Var5 == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        local_90 = (code *)0x0;
      }
      else {
        local_38._M_obj = &local_90;
        (*p_Var5)(_Op_clone,&peVar3->m_userContext,&local_38);
      }
      Runtime::CreateScript((Runtime *)local_60,(BufferPtr *)bytecode,&local_80);
      if ((element_type *)local_60._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(((_Rep_type *)local_60._8_8_)->_M_impl).super__Rb_tree_header;
          (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + _S_black;
          UNLOCK();
        }
        else {
          p_Var1 = &(((_Rep_type *)local_60._8_8_)->_M_impl).super__Rb_tree_header;
          (p_Var1->_M_header)._M_color = (p_Var1->_M_header)._M_color + _S_black;
        }
      }
      (this->m_script).super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_60._0_8_;
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (this->m_script).super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->m_script).super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if ((element_type *)local_60._8_8_ != (element_type *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
      }
      if (local_90 != (code *)0x0) {
        (*local_90)(3,&local_90,0);
        local_90 = (code *)0x0;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_storage._M_ptr !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._M_storage._M_ptr);
      }
      pSVar2 = &this->m_script;
      pVVar6 = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (value = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>).
                   _M_impl.super__Vector_impl_data._M_start; value != pVVar6; value = value + 1) {
        Script::Push((pSVar2->super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,value);
      }
      Script::CallBytecodeFunction
                ((pSVar2->super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 ,(FunctionDefinitionPtr *)local_70,Finish);
      Script::Execute((pSVar2->super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
      bVar7 = Script::IsFinished((pSVar2->
                                 super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>)
                                 ._M_ptr);
      if (bVar7) {
        Script::Pop((Variant *)local_60,
                    (pSVar2->super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr);
        Variant::operator=(&this->m_returnValue,(Variant *)local_60);
        Variant::~Variant((Variant *)local_60);
      }
      goto LAB_001f2db7;
    }
    message = "Native function can\'t be called as asynchronously as a coroutine";
  }
  Script::Error((script->super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                message);
LAB_001f2db7:
  if ((element_type *)local_70._8_8_ != (element_type *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

inline_t Coroutine::Coroutine(const std::shared_ptr<Script> & script, RuntimeID functionID, const Parameters & params)
	{
		auto runtime = script->GetRuntime();
		FunctionDefinitionPtr functionDef = runtime->FindFunction(functionID);
		if (!functionDef)
		{
			script->Error("Could not find function definition for coroutine");
			return;
		}
		if (!functionDef->GetBytecode())
		{
			script->Error("Native function can't be called as asynchronously as a coroutine");
			return;
		}

		// Create a script to act as a coroutine.
		m_script = std::static_pointer_cast<Script>(runtime->CreateScript(functionDef->GetBytecode(), script->GetUserContext()));

		// Push all parameters in script stack
		for (const auto & param : params)
			m_script->Push(param);

		// Call the bytecode function, indicating the script should finish execution on return
		m_script->CallBytecodeFunction(functionDef, Script::OnReturn::Finish);

		// Initial script execution
		m_script->Execute();
		if (m_script->IsFinished())
			m_returnValue = m_script->Pop();
	}